

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_CalculateIssuanceValueTest_Test::
~ConfidentialTransaction_CalculateIssuanceValueTest_Test
          (ConfidentialTransaction_CalculateIssuanceValueTest_Test *this)

{
  ConfidentialTransaction_CalculateIssuanceValueTest_Test *this_local;
  
  ~ConfidentialTransaction_CalculateIssuanceValueTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTransaction, CalculateIssuanceValueTest) {
  Txid txid("d1efb621591f94f66a9c3161addd6d7db0ae82cc1674e3b098051793fb70028a");
  uint32_t vout = 1;
  ByteData256 contract_hash_empty;
  IssuanceParameter param;

  // not blind
  EXPECT_NO_THROW(
      (param = ConfidentialTransaction::CalculateIssuanceValue(
          txid, vout, false, contract_hash_empty, ByteData256())));
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c");
  EXPECT_STREQ(
      param.asset.GetHex().c_str(),
      "598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07");
  EXPECT_STREQ(
      param.token.GetHex().c_str(),
      "4dda0f2bc939213feae25a16dcade5f235ab28564d56dc4f7f69d977d441f993");

  // contract hash
  ByteData256 contract_hash(
      "fdf4d615b2b78b61c85ccd5129584dc1b7cbd6c75a1c799cc0738bc783dafd68");
  EXPECT_NO_THROW(
      (param = ConfidentialTransaction::CalculateIssuanceValue(txid, vout,
                                                               false,
                                                               contract_hash,
                                                               ByteData256())));
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "9ed3d5d8f571d5b6ad03b5d17cee4fec1de36b65f4eb7d84aad264ddf260c09c");
  EXPECT_STREQ(
      param.asset.GetHex().c_str(),
      "76ab84689c4b03e254c89188962d262d159d21b4f1ccdfaf061d79dd53ddf303");
  EXPECT_STREQ(
      param.token.GetHex().c_str(),
      "e9aab5dcff7203b1dd77d42b727058835eb0034b3fad91e6d2bb69c21d7a5879");

  // blind
  EXPECT_NO_THROW(
      (param = ConfidentialTransaction::CalculateIssuanceValue(
          txid, vout, true, contract_hash_empty, ByteData256())));
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c");
  EXPECT_STREQ(
      param.asset.GetHex().c_str(),
      "598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07");
  EXPECT_STREQ(
      param.token.GetHex().c_str(),
      "3b4a21657d88d5004008ccf00441270a20984228eb06289660b63b475b539610");
}